

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O2

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)3>(void)

{
  vector_t<CPUType::AVX2,_int> input_00;
  vector_t<CPUType::AVX2,_int> input_01;
  undefined8 uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  AlignedVector<signed_char> input;
  AlignedVector<int> output;
  dvector_t<(intgemm::CPUType)3,_int> result32b;
  dvector_t<(intgemm::CPUType)3,_int> result32a;
  dvector_t<(intgemm::CPUType)3,_short> result16;
  AlignedVector<signed_char> local_178;
  AlignedVector<int> local_160;
  StringRef local_150;
  char *local_140;
  size_type sStack_138;
  Flags FStack_130;
  undefined4 uStack_12c;
  longlong lStack_128;
  dvector_t<(intgemm::CPUType)3,_int> local_120;
  dvector_t<(intgemm::CPUType)3,_int> local_e0;
  AssertionHandler local_a0;
  
  if (2 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_178,0x20,0x40);
    AlignedVector<int>::AlignedVector(&local_160,0x20,0x40);
    for (sVar2 = 0; local_178.size_ != sVar2; sVar2 = sVar2 + 1) {
      *(char *)((long)(longlong *)local_178.mem_ + sVar2) = (char)sVar2 + -0x10;
    }
    local_e0.first[0] = *(longlong *)local_178.mem_;
    local_e0.first[1] = ((longlong *)local_178.mem_)[1];
    local_e0.first[2] = ((longlong *)local_178.mem_)[2];
    local_e0.first[3] = ((longlong *)local_178.mem_)[3];
    kernels::upcast8to16
              ((dvector_t<(intgemm::CPUType)3,_short> *)&local_a0,
               *(vector_t<CPUType::AVX2,_int> *)local_178.mem_);
    local_120.first[0] = (longlong)local_a0.m_assertionInfo.macroName.m_start;
    local_120.first[1] = local_a0.m_assertionInfo.macroName.m_size;
    local_120.first[2] = (longlong)local_a0.m_assertionInfo.lineInfo.file;
    local_120.first[3] = local_a0.m_assertionInfo.lineInfo.line;
    input_00[1] = local_a0.m_assertionInfo.macroName.m_size;
    input_00[0] = (longlong)local_a0.m_assertionInfo.macroName.m_start;
    input_00[2] = (longlong)local_a0.m_assertionInfo.lineInfo.file;
    input_00[3] = local_a0.m_assertionInfo.lineInfo.line;
    kernels::upcast16to32(&local_e0,input_00);
    uVar1 = local_a0._56_8_;
    local_140 = local_a0.m_assertionInfo.capturedExpression.m_start;
    sStack_138 = local_a0.m_assertionInfo.capturedExpression.m_size;
    FStack_130 = local_a0.m_assertionInfo.resultDisposition;
    uStack_12c = local_a0.m_assertionInfo._52_4_;
    lStack_128._0_1_ = local_a0.m_reaction.shouldDebugBreak;
    lStack_128._1_1_ = local_a0.m_reaction.shouldThrow;
    lStack_128._2_1_ = local_a0.m_completed;
    lStack_128._3_5_ = local_a0._59_5_;
    input_01[1] = local_a0.m_assertionInfo.capturedExpression.m_size;
    input_01[0] = (longlong)local_a0.m_assertionInfo.capturedExpression.m_start;
    input_01[2] = local_a0.m_assertionInfo._48_8_;
    local_a0.m_reaction = SUB82(uVar1,0);
    local_a0.m_completed = SUB81(uVar1,2);
    local_a0._59_5_ = SUB85(uVar1,3);
    input_01[3]._0_1_ = local_a0.m_reaction.shouldDebugBreak;
    input_01[3]._1_1_ = local_a0.m_reaction.shouldThrow;
    input_01[3]._2_1_ = local_a0.m_completed;
    input_01[3]._3_5_ = local_a0._59_5_;
    kernels::upcast16to32(&local_120,input_01);
    *(longlong *)local_160.mem_ = local_e0.first[0];
    *(longlong *)((long)local_160.mem_ + 8) = local_e0.first[1];
    *(longlong *)((long)local_160.mem_ + 0x10) = local_e0.first[2];
    *(longlong *)((long)local_160.mem_ + 0x18) = local_e0.first[3];
    *(longlong *)((long)local_160.mem_ + 0x20) = local_e0.second[0];
    *(longlong *)((long)local_160.mem_ + 0x28) = local_e0.second[1];
    *(longlong *)((long)local_160.mem_ + 0x30) = local_e0.second[2];
    *(longlong *)((long)local_160.mem_ + 0x38) = local_e0.second[3];
    *(longlong *)((long)local_160.mem_ + 0x40) = local_120.first[0];
    *(longlong *)((long)local_160.mem_ + 0x48) = local_120.first[1];
    *(longlong *)((long)local_160.mem_ + 0x50) = local_120.first[2];
    *(longlong *)((long)local_160.mem_ + 0x58) = local_120.first[3];
    *(longlong *)((long)local_160.mem_ + 0x60) = local_120.second[0];
    *(longlong *)((long)local_160.mem_ + 0x68) = local_120.second[1];
    *(longlong *)((long)local_160.mem_ + 0x70) = local_120.second[2];
    *(longlong *)((long)local_160.mem_ + 0x78) = local_120.second[3];
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < local_160.size_; uVar4 = uVar4 + 1) {
      local_e0.first[0] = 0x18fab9;
      local_e0.first[1] = 5;
      local_120.first[0] = 0x196240;
      local_120.first[1] = 0x65;
      Catch::StringRef::StringRef(&local_150,"output[i] == int32_t(input[i])");
      Catch::AssertionHandler::AssertionHandler
                (&local_a0,(StringRef *)&local_e0,(SourceLineInfo *)&local_120,local_150,
                 ContinueOnFailure);
      local_120.first[0] = (long)local_160.mem_ + lVar3;
      local_140 = (char *)CONCAT44(local_140._4_4_,
                                   (int)*(char *)((long)(longlong *)local_178.mem_ + uVar4));
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_e0,(ExprLhs<int_const&> *)&local_120
                 ,(int *)&local_140);
      Catch::AssertionHandler::handleExpr(&local_a0,(ITransientExpression *)&local_e0);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_e0);
      Catch::AssertionHandler::complete(&local_a0);
      Catch::AssertionHandler::~AssertionHandler(&local_a0);
      lVar3 = lVar3 + 4;
    }
    free(local_160.mem_);
    free(local_178.mem_);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}